

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OperatorExpressions.h
# Opt level: O2

void __thiscall
slang::ast::ConditionalExpression::visitExprs<slang::ast::builtins::MonitorVisitor&>
          (ConditionalExpression *this,MonitorVisitor *visitor)

{
  Expression *this_00;
  long lVar1;
  Condition *cond;
  pointer this_01;
  
  this_01 = (this->conditions).data_;
  for (lVar1 = (this->conditions).size_ << 4; lVar1 != 0; lVar1 = lVar1 + -0x10) {
    this_00 = not_null<const_slang::ast::Expression_*>::get(&this_01->expr);
    Expression::visit<slang::ast::builtins::MonitorVisitor&>(this_00,visitor);
    this_01 = this_01 + 1;
  }
  Expression::visit<slang::ast::builtins::MonitorVisitor&>(this->left_,visitor);
  Expression::visit<slang::ast::builtins::MonitorVisitor&>(this->right_,visitor);
  return;
}

Assistant:

void visitExprs(TVisitor&& visitor) const {
        for (auto& cond : conditions)
            cond.expr->visit(visitor);

        left().visit(visitor);
        right().visit(visitor);
    }